

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O0

IndexPair slang::IntervalMapDetails::distribute
                    (uint32_t numNodes,uint32_t numElements,uint32_t capacity,uint32_t *newSizes,
                    uint32_t position)

{
  IndexPair IVar1;
  int iVar2;
  long in_RCX;
  int in_ESI;
  uint in_EDI;
  uint in_R8D;
  uint32_t n;
  uint32_t sum;
  uint32_t extra;
  uint32_t perNode;
  IndexPair posPair;
  uint local_44;
  pair<unsigned_int,_unsigned_int> local_40;
  uint local_38;
  uint local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  long local_20;
  uint local_c;
  pair<unsigned_int,_unsigned_int> local_8;
  
  local_28 = (in_ESI + 1U) / in_EDI;
  local_2c = (in_ESI + 1U) % in_EDI;
  local_30 = 0;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_c = in_EDI;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_int,_true>
            (&local_8,&local_c,&local_30);
  local_34 = 0;
  for (local_38 = 0; local_38 != local_c; local_38 = local_38 + 1) {
    iVar2 = local_28 + (local_38 < local_2c);
    *(int *)(local_20 + (ulong)local_38 * 4) = iVar2;
    local_34 = iVar2 + local_34;
    if ((local_8.first == local_c) && (local_24 < local_34)) {
      local_44 = local_24 - (local_34 - *(int *)(local_20 + (ulong)local_38 * 4));
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int,_true>
                (&local_40,&local_38,&local_44);
      std::pair<unsigned_int,_unsigned_int>::operator=(&local_8,&local_40);
    }
  }
  *(int *)(local_20 + (ulong)local_8.first * 4) = *(int *)(local_20 + (ulong)local_8.first * 4) + -1
  ;
  IVar1.second = local_8.second;
  IVar1.first = local_8.first;
  return IVar1;
}

Assistant:

IndexPair distribute(uint32_t numNodes, uint32_t numElements, uint32_t capacity, uint32_t* newSizes,
                     uint32_t position) {
    SLANG_ASSERT(numElements + 1 <= numNodes * capacity);
    SLANG_ASSERT(position <= numElements);
    SLANG_ASSERT(numNodes > 0);

    // left-leaning even distribution
    const uint32_t perNode = (numElements + 1) / numNodes;
    const uint32_t extra = (numElements + 1) % numNodes;
    IndexPair posPair(numNodes, 0);
    uint32_t sum = 0;
    for (uint32_t n = 0; n != numNodes; ++n) {
        sum += newSizes[n] = perNode + (n < extra);
        if (posPair.first == numNodes && sum > position)
            posPair = {n, position - (sum - newSizes[n])};
    }

    // Subtract the new element that was added.
    SLANG_ASSERT(sum == numElements + 1);
    SLANG_ASSERT(posPair.first < numNodes);
    SLANG_ASSERT(newSizes[posPair.first]);
    --newSizes[posPair.first];

    return posPair;
}